

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCasePackUnorm::test
          (ShaderBitfieldOperationCasePackUnorm *this,Data *data)

{
  return ((int)(data->inVec4[3] * 255.0 + 0.5) << 0x18 |
         (int)((float)((ulong)*(undefined8 *)(data->inVec4 + 1) >> 0x20) * 255.0 + 0.5) * 0x10000 &
         0xff0000U |
         ((int)((float)*(undefined8 *)(data->inVec4 + 1) * 255.0 + 0.5) & 0xffU) << 8 |
         (int)(data->inVec4[0] * 255.0 + 0.5) & 0xffU) == data->outUvec4[0];
}

Assistant:

virtual bool test(Data const* data)
	{
		GLuint expected =
			((int(data->inVec4[0] * 255.0 + 0.5) & 0xFF) << 0) | ((int(data->inVec4[1] * 255.0 + 0.5) & 0xFF) << 8) |
			((int(data->inVec4[2] * 255.0 + 0.5) & 0xFF) << 16) | ((int(data->inVec4[3] * 255.0 + 0.5) & 0xFF) << 24);
		if (expected != data->outUvec4[0])
		{
			return false;
		}
		return true;
	}